

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.hh
# Opt level: O0

bool __thiscall
dtc::fdt::checking::property_type_checker<(dtc::fdt::property_value::value_type)0>::check
          (property_type_checker<(dtc::fdt::property_value::value_type)0> *this,device_tree *param_1
          ,node_ptr *param_2,property_ptr *p)

{
  bool bVar1;
  element_type *peVar2;
  pointer ppVar3;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  local_50;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  local_48;
  __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
  local_40;
  value_iterator e;
  value_iterator i;
  property_ptr *p_local;
  node_ptr *param_2_local;
  device_tree *param_1_local;
  property_type_checker<(dtc::fdt::property_value::value_type)0> *this_local;
  
  peVar2 = std::__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)p);
  e = property::begin(peVar2);
  peVar2 = std::__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)p);
  local_40._M_current = (property_value *)property::end(peVar2);
  do {
    bVar1 = __gnu_cxx::operator!=(&e,&local_40);
    if (!bVar1) {
      peVar2 = std::
               __shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p);
      local_48._M_current = (property_value *)property::begin(peVar2);
      peVar2 = std::
               __shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p);
      local_50._M_current = (property_value *)property::end(peVar2);
      bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
      return bVar1;
    }
    ppVar3 = __gnu_cxx::
             __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
             ::operator->(&e);
    bVar1 = property_value::is_string(ppVar3);
    if (!bVar1) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
               ::operator->(&e);
      bVar1 = property_value::is_string_list(ppVar3);
      if (!bVar1) {
        return false;
      }
    }
    __gnu_cxx::
    __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
    ::operator++(&e);
  } while( true );
}

Assistant:

virtual bool check(device_tree *, const node_ptr &, property_ptr p)
	{
		for (property::value_iterator i=p->begin(),e=p->end() ; i!=e ;
		     ++i)
		{
			if (!(i->is_string() || i->is_string_list()))
			{
				return false;
			}
		}
		return p->begin() != p->end();
	}